

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

QString * __thiscall QMakeLocalFileName::local(QMakeLocalFileName *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->real_name).d.ptr != (char16_t *)0x0) && ((this->local_name).d.ptr == (char16_t *)0x0))
  {
    Option::normalizePath((QString *)&local_38,&this->real_name,true,true);
    pDVar2 = (this->local_name).d.d;
    pcVar3 = (this->local_name).d.ptr;
    (this->local_name).d.d = local_38.d;
    (this->local_name).d.ptr = local_38.ptr;
    qVar1 = (this->local_name).d.size;
    (this->local_name).d.size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return &this->local_name;
  }
  __stack_chk_fail();
}

Assistant:

const QString
&QMakeLocalFileName::local() const
{
    if (!isNull() && local_name.isNull())
        local_name = Option::normalizePath(real_name);
    return local_name;
}